

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O0

vertex_t __thiscall
Gudhi::ripser::Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_>::
get_max_vertex(Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *this,
              simplex_t idx,dimension_t k,vertex_t param_3)

{
  uint uVar1;
  logic_error *this_00;
  char in_CL;
  byte bVar2;
  undefined4 in_register_00000014;
  undefined7 in_register_00000031;
  vertex_t param_3_local;
  dimension_t k_local;
  simplex_t idx_local;
  Bitfield_encoding<Gudhi::ripser::TParams<true,_unsigned___int128,_float>_> *this_local;
  
  if ('\0' < in_CL) {
    bVar2 = (char)this->bits_per_vertex * (in_CL + -1);
    uVar1 = (uint)(CONCAT71(in_register_00000031,k) >> (bVar2 & 0x3f)) |
            param_3 << 0x40 - (bVar2 & 0x3f);
    if ((bVar2 & 0x40) != 0) {
      uVar1 = (uint)(CONCAT44(in_register_00000014,param_3) >> (bVar2 & 0x3f));
    }
    return uVar1;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

vertex_t get_max_vertex(const simplex_t idx, dimension_t k, const vertex_t) const {
      GUDHI_assert(k > 0);
      --k;
#ifdef USE_N_MINUS_K
      return static_cast<vertex_t>(idx >> (bits_per_vertex * k)) + k;
#else
      return static_cast<vertex_t>(idx >> (bits_per_vertex * k));
#endif
    }